

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O2

void test6(void)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  int i;
  long lVar4;
  int (*paiVar5) [32];
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::spawn<void(int,int&),int&,int&>(depprev,mx[0],mx[0]);
  paiVar5 = mx;
  for (lVar4 = 1; lVar4 < nsize; lVar4 = lVar4 + 1) {
    depspawn::spawn<void(int,int&),int&,int&>(depprev,*paiVar5,paiVar5[1]);
    paiVar5 = paiVar5 + 1;
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  paiVar5 = mx;
  uVar3 = 0;
  iVar1 = nsize;
  while ((long)uVar3 < (long)iVar1) {
    if (uVar3 + 1 != (ulong)(uint)(*paiVar5)[0]) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar3);
      poVar2 = std::operator<<(poVar2," -> ");
      std::ostream::operator<<(poVar2,(*paiVar5)[0]);
      doerror();
      iVar1 = nsize;
    }
    (*paiVar5)[0] = 0;
    paiVar5 = paiVar5 + 1;
    uVar3 = uVar3 + 1;
  }
  pr("f(int, int&) dep->");
  return;
}

Assistant:

void test6() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(depprev, mx[0][0], mx[0][0]);
  
  for(int i = 1; i < nsize; i++) {
    spawn(depprev, mx[i-1][0], mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (i+1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(int, int&) dep->");
  
}